

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::hex_writer>
          *f)

{
  size_t n;
  byte bVar1;
  ulong n_00;
  ulong uVar2;
  char_type fill;
  wchar_t local_34;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_30;
  
  n_00 = (ulong)(uint)specs->width;
  n = f->size_;
  uVar2 = n_00 - n;
  if (n_00 < n || uVar2 == 0) {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,n);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
                  *)f,&local_30);
  }
  else {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,n_00);
    local_34 = (specs->fill).data_[0];
    bVar1 = specs->field_0x9 & 0xf;
    if (bVar1 == 3) {
      local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar2 >> 1,&local_34);
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
                    *)f,&local_30);
      uVar2 = uVar2 - (uVar2 >> 1);
    }
    else {
      if (bVar1 == 2) {
        local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar2,&local_34);
        padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
        ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
                      *)f,&local_30);
        return;
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
                    *)f,&local_30);
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar2,&local_34);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }